

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O1

bool __thiscall re2::PCRE::CheckRewriteString(PCRE *this,StringPiece *rewrite,string *error)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  
  lVar6 = (long)rewrite->length_;
  bVar9 = 0 < lVar6;
  if (lVar6 < 1) {
    uVar5 = 0xffffffff;
  }
  else {
    pcVar8 = rewrite->ptr_;
    pcVar7 = pcVar8 + lVar6;
    uVar5 = 0xffffffff;
    do {
      bVar1 = false;
      if (*pcVar8 == '\\') {
        pcVar8 = pcVar8 + 1;
        if (pcVar8 == pcVar7) {
          pcVar4 = (char *)error->_M_string_length;
          pcVar3 = "Rewrite schema error: \'\\\' not allowed at end.";
LAB_00120f02:
          std::__cxx11::string::_M_replace((ulong)error,0,pcVar4,(ulong)pcVar3);
          bVar1 = true;
        }
        else if (*pcVar8 != 0x5c) {
          uVar2 = (int)*pcVar8 - 0x30;
          if (9 < uVar2) {
            pcVar4 = (char *)error->_M_string_length;
            pcVar3 = "Rewrite schema error: \'\\\' must be followed by a digit or \'\\\'.";
            goto LAB_00120f02;
          }
          if ((int)uVar5 <= (int)uVar2) {
            uVar5 = uVar2;
          }
          bVar1 = false;
        }
      }
      if (bVar1) break;
      pcVar8 = pcVar8 + 1;
      bVar9 = pcVar8 < pcVar7;
    } while (bVar9);
  }
  if (bVar9) {
    bVar9 = false;
  }
  else if ((int)uVar5 < 0) {
    bVar9 = true;
  }
  else {
    bVar9 = false;
    SStringPrintf(error,
                  "Rewrite schema requests %d matches, but the regexp only has %d parenthesized subexpressions."
                  ,(ulong)uVar5,0xffffffff);
  }
  return bVar9;
}

Assistant:

bool PCRE::CheckRewriteString(const StringPiece& rewrite, string* error) const {
  int max_token = -1;
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    int c = *s;
    if (c != '\\') {
      continue;
    }
    if (++s == end) {
      *error = "Rewrite schema error: '\\' not allowed at end.";
      return false;
    }
    c = *s;
    if (c == '\\') {
      continue;
    }
    if (!isdigit(c)) {
      *error = "Rewrite schema error: "
               "'\\' must be followed by a digit or '\\'.";
      return false;
    }
    int n = (c - '0');
    if (max_token < n) {
      max_token = n;
    }
  }

  if (max_token > NumberOfCapturingGroups()) {
    SStringPrintf(error, "Rewrite schema requests %d matches, "
                  "but the regexp only has %d parenthesized subexpressions.",
                  max_token, NumberOfCapturingGroups());
    return false;
  }
  return true;
}